

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockVector::IncrementallySortBlocks(VmaBlockVector *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  VmaDeviceMemoryBlock **ppVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VmaDeviceMemoryBlock **__b;
  long in_RDI;
  size_t i;
  ulong local_10;
  
  if (((*(byte *)(in_RDI + 0xb4) & 1) != 0) && (*(int *)(in_RDI + 0x3c) != 4)) {
    for (local_10 = 1;
        sVar3 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::size
                          ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                            *)(in_RDI + 0x90)), local_10 < sVar3; local_10 = local_10 + 1) {
      ppVVar4 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::
                operator[]((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                            *)(in_RDI + 0x90),local_10 - 1);
      iVar1 = (*(*ppVVar4)->m_pMetadata->_vptr_VmaBlockMetadata[6])();
      ppVVar4 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::
                operator[]((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                            *)(in_RDI + 0x90),local_10);
      iVar2 = (*(*ppVVar4)->m_pMetadata->_vptr_VmaBlockMetadata[6])();
      if (CONCAT44(extraout_var_00,iVar2) < CONCAT44(extraout_var,iVar1)) {
        ppVVar4 = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::
                  operator[]((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                              *)(in_RDI + 0x90),local_10 - 1);
        __b = VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::
              operator[]((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>
                          *)(in_RDI + 0x90),local_10);
        std::swap<VmaDeviceMemoryBlock*>(ppVVar4,__b);
        return;
      }
    }
  }
  return;
}

Assistant:

void VmaBlockVector::IncrementallySortBlocks()
{
    if (!m_IncrementalSort)
        return;
    if (m_Algorithm != VMA_POOL_CREATE_LINEAR_ALGORITHM_BIT)
    {
        // Bubble sort only until first swap.
        for (size_t i = 1; i < m_Blocks.size(); ++i)
        {
            if (m_Blocks[i - 1]->m_pMetadata->GetSumFreeSize() > m_Blocks[i]->m_pMetadata->GetSumFreeSize())
            {
                VMA_SWAP(m_Blocks[i - 1], m_Blocks[i]);
                return;
            }
        }
    }
}